

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# colAlloc.c
# Opt level: O3

void PoolAllocPages(MemoryPool *pool,size_t number)

{
  int *piVar1;
  byte *pbVar2;
  undefined1 auVar3 [16];
  undefined1 auVar4 [16];
  undefined1 auVar5 [16];
  undefined1 auVar6 [16];
  undefined1 auVar7 [16];
  undefined1 auVar8 [16];
  undefined1 auVar9 [16];
  undefined1 auVar10 [16];
  undefined1 auVar11 [16];
  undefined1 auVar12 [16];
  undefined1 auVar13 [16];
  undefined1 auVar14 [16];
  undefined1 auVar15 [16];
  undefined1 auVar16 [16];
  undefined1 auVar17 [16];
  undefined1 auVar18 [16];
  undefined1 auVar19 [16];
  undefined1 auVar20 [16];
  undefined1 auVar21 [16];
  undefined1 auVar22 [16];
  undefined1 auVar23 [16];
  char cVar24;
  Page *pacVar25;
  Page *pacVar26;
  undefined1 auVar27 [16];
  undefined1 auVar28 [16];
  undefined1 auVar29 [16];
  undefined1 auVar30 [16];
  undefined1 auVar31 [16];
  byte bVar32;
  int iVar33;
  void *pvVar34;
  void *pvVar35;
  AddressRange *pAVar36;
  ulong uVar37;
  AddressRange *pAVar38;
  long lVar39;
  size_t i;
  ulong uVar40;
  size_t size;
  AddressRange **ppAVar41;
  ulong uVar42;
  ulong uVar43;
  Page *pacVar44;
  size_t size_00;
  ulong uVar45;
  Page *addr;
  ulong __denom;
  bool bVar46;
  undefined1 auVar47 [16];
  undefined1 auVar48 [16];
  undefined1 in_XMM1 [16];
  undefined1 auVar50 [16];
  undefined1 auVar51 [16];
  undefined1 auVar52 [16];
  undefined1 auVar53 [16];
  undefined1 auVar54 [16];
  undefined1 auVar55 [16];
  undefined1 auVar56 [16];
  undefined1 auVar57 [16];
  undefined1 auVar58 [16];
  undefined1 auVar59 [16];
  undefined1 in_XMM2 [16];
  undefined1 auVar60 [16];
  undefined1 auVar61 [16];
  undefined1 auVar62 [16];
  undefined1 auVar63 [16];
  undefined1 auVar64 [16];
  undefined1 auVar65 [16];
  undefined1 auVar66 [16];
  undefined1 auVar67 [16];
  undefined1 auVar68 [16];
  undefined1 auVar69 [16];
  int iVar72;
  int iVar73;
  undefined1 auVar70 [16];
  int iVar74;
  undefined1 auVar71 [16];
  undefined1 auVar75 [16];
  undefined1 auVar76 [16];
  undefined1 auVar77 [16];
  undefined1 auVar78 [16];
  undefined1 auVar79 [16];
  undefined1 auVar80 [16];
  undefined1 auVar81 [16];
  undefined1 auVar82 [16];
  undefined1 auVar83 [16];
  undefined1 auVar84 [16];
  undefined1 auVar85 [16];
  undefined1 auVar86 [16];
  undefined1 auVar87 [16];
  int iVar88;
  int iVar92;
  undefined1 auVar89 [16];
  undefined1 auVar90 [16];
  undefined1 auVar91 [16];
  lldiv_t lVar93;
  void *local_48;
  long lVar49;
  
  pvVar34 = pthread_getspecific(tsdKey);
  __denom = systemPageSize >> 0xc;
  if (number == 1) {
    bVar46 = 1 < pool->generation;
    size_00 = 1;
LAB_001062d9:
    if (((allocGranularity >> ((byte)shiftPage & 0x3f)) + 0xff & size_00) != 0) {
      pvVar35 = pthread_getspecific(tsdKey);
      iVar33 = *(int *)((long)pvVar35 + 0x460);
      *(int *)((long)pvVar35 + 0x460) = iVar33 + 1;
      if (iVar33 == 0) {
        pthread_mutex_lock((pthread_mutex_t *)&mutexRange);
      }
      pAVar36 = ranges;
      if (ranges != (AddressRange *)0x0) {
LAB_00106342:
        pAVar38 = pAVar36;
        uVar37 = pAVar38->size;
        if (size_00 <= pAVar38->free) {
          uVar40 = pAVar38->first;
          if (size_00 != 1) {
            if (uVar40 < uVar37) {
              uVar45 = 0xffffffffffffffff;
              uVar42 = size_00;
              do {
                uVar43 = size_00;
                if (*(char *)((long)&pAVar38[1].next + uVar40) == '\0') {
                  if (uVar42 == size_00) {
                    uVar45 = uVar40;
                  }
                  uVar43 = uVar42 - 1;
                  if (uVar42 - 1 == 0) goto LAB_001063bc;
                }
                uVar40 = uVar40 + 1;
                uVar42 = uVar43;
              } while (uVar37 != uVar40);
            }
            goto LAB_0010634f;
          }
          uVar45 = uVar40;
          if (*(char *)((long)&pAVar38[1].next + uVar40) != '\0') {
            if (uVar40 < uVar37) {
              do {
                uVar45 = uVar40;
                if (*(char *)((long)&pAVar38[1].next + uVar40) == '\0') goto LAB_001063bc;
                uVar40 = uVar40 + 1;
              } while (uVar37 != uVar40);
            }
            goto LAB_0010634f;
          }
          goto LAB_00106546;
        }
        goto LAB_0010634f;
      }
      ppAVar41 = &ranges;
      uVar37 = 0;
      goto LAB_00106499;
    }
  }
  else {
    lVar93 = lldiv(number,__denom);
    size_00 = (lVar93.quot + 1) - (ulong)(lVar93.rem == 0);
    __denom = (__denom * size_00 - number) + 1;
    if (0x7f < size_00) {
      __denom = 1;
    }
    bVar46 = 1 < pool->generation;
    if (size_00 < 0x81) goto LAB_001062d9;
  }
  addr = (Page *)PlatReserveRange(size_00,1);
  if (addr == (Page *)0x0) {
    addr = (Page *)0x0;
    Col_Error(COL_FATAL,ColibriDomain,2,"Address range allocation failed");
    goto LAB_00106b85;
  }
  pvVar35 = pthread_getspecific(tsdKey);
  iVar33 = *(int *)((long)pvVar35 + 0x460);
  *(int *)((long)pvVar35 + 0x460) = iVar33 + 1;
  if (iVar33 == 0) {
    pthread_mutex_lock((pthread_mutex_t *)&mutexRange);
  }
  pAVar36 = (AddressRange *)malloc(0x29);
  pAVar36->next = dedicatedRanges;
  pAVar36->base = addr;
  pAVar36->size = size_00;
  pAVar36->free = 0;
  pAVar36->first = size_00;
  *(bool *)&pAVar36[1].next = bVar46;
  dedicatedRanges = pAVar36;
  pvVar35 = pthread_getspecific(tsdKey);
  piVar1 = (int *)((long)pvVar35 + 0x460);
  *piVar1 = *piVar1 + -1;
  iVar33 = *piVar1;
  goto joined_r0x00106b77;
LAB_001063bc:
  if (uVar45 != 0xffffffffffffffff) {
LAB_00106546:
    local_48 = pAVar38->base;
    goto LAB_0010654f;
  }
LAB_0010634f:
  pAVar36 = pAVar38->next;
  if (pAVar38->next == (AddressRange *)0x0) goto LAB_0010645f;
  goto LAB_00106342;
LAB_0010645f:
  uVar37 = uVar37 * 2;
  ppAVar41 = &pAVar38->next;
LAB_00106499:
  uVar40 = 0x8000;
  if (uVar37 < 0x8000) {
    uVar40 = uVar37;
  }
  size = 0x100;
  if (ranges != (AddressRange *)0x0) {
    size = uVar40;
  }
  local_48 = PlatReserveRange(size,0);
  if (local_48 == (void *)0x0) {
    addr = (Page *)0x0;
    Col_Error(COL_FATAL,ColibriDomain,2,"Address range reservation failed");
  }
  else {
    uVar37 = size + 7 >> 3;
    pAVar38 = (AddressRange *)malloc(uVar37 + size + 0x28);
    ((AddressRange *)ppAVar41)->next = pAVar38;
    pAVar38->base = local_48;
    uVar45 = 0;
    pAVar38->next = (AddressRange *)0x0;
    pAVar38->size = size;
    pAVar38->free = size;
    pAVar38->first = 0;
    memset(pAVar38 + 1,0,uVar37 + size);
LAB_0010654f:
    addr = (Page *)((uVar45 << ((byte)shiftPage & 0x3f)) + (long)local_48);
    iVar33 = PlatAllocPages(addr,size_00);
    if (iVar33 == 0) {
      Col_Error(COL_FATAL,ColibriDomain,2,"Page allocation failed");
    }
    else {
      *(char *)((long)&pAVar38[1].next + uVar45) = -(char)size_00;
      auVar31 = _DAT_00116510;
      auVar30 = _DAT_00116500;
      auVar29 = _DAT_001164f0;
      auVar28 = _DAT_001164e0;
      auVar27 = _DAT_001164d0;
      auVar48 = _DAT_001164c0;
      auVar59 = _DAT_001164b0;
      if (1 < size_00) {
        lVar39 = size_00 - 2;
        auVar47._8_4_ = (int)lVar39;
        auVar47._0_8_ = lVar39;
        auVar47._12_4_ = (int)((ulong)lVar39 >> 0x20);
        uVar37 = 0;
        do {
          auVar68._8_4_ = (int)uVar37;
          auVar68._0_8_ = uVar37;
          auVar68._12_4_ = (int)(uVar37 >> 0x20);
          auVar70 = auVar47 ^ auVar31;
          auVar75 = (auVar68 | auVar30) ^ auVar31;
          iVar33 = auVar70._0_4_;
          iVar88 = -(uint)(iVar33 < auVar75._0_4_);
          iVar72 = auVar70._4_4_;
          auVar77._4_4_ = -(uint)(iVar72 < auVar75._4_4_);
          iVar73 = auVar70._8_4_;
          iVar92 = -(uint)(iVar73 < auVar75._8_4_);
          iVar74 = auVar70._12_4_;
          auVar77._12_4_ = -(uint)(iVar74 < auVar75._12_4_);
          auVar50._4_4_ = iVar88;
          auVar50._0_4_ = iVar88;
          auVar50._8_4_ = iVar92;
          auVar50._12_4_ = iVar92;
          auVar50 = pshuflw(in_XMM1,auVar50,0xe8);
          auVar76._4_4_ = -(uint)(auVar75._4_4_ == iVar72);
          auVar76._12_4_ = -(uint)(auVar75._12_4_ == iVar74);
          auVar76._0_4_ = auVar76._4_4_;
          auVar76._8_4_ = auVar76._12_4_;
          auVar60 = pshuflw(in_XMM2,auVar76,0xe8);
          auVar77._0_4_ = auVar77._4_4_;
          auVar77._8_4_ = auVar77._12_4_;
          auVar75 = pshuflw(auVar50,auVar77,0xe8);
          auVar70._8_4_ = 0xffffffff;
          auVar70._0_8_ = 0xffffffffffffffff;
          auVar70._12_4_ = 0xffffffff;
          auVar70 = (auVar75 | auVar60 & auVar50) ^ auVar70;
          auVar70 = packssdw(auVar70,auVar70);
          cVar24 = (char)uVar37;
          if ((auVar70 & (undefined1  [16])0x1) != (undefined1  [16])0x0) {
            *(char *)((long)&pAVar38[1].next + uVar37 + uVar45 + 1) = cVar24 + '\x01';
          }
          auVar60._4_4_ = iVar88;
          auVar60._0_4_ = iVar88;
          auVar60._8_4_ = iVar92;
          auVar60._12_4_ = iVar92;
          auVar77 = auVar76 & auVar60 | auVar77;
          auVar70 = packssdw(auVar77,auVar77);
          auVar75._8_4_ = 0xffffffff;
          auVar75._0_8_ = 0xffffffffffffffff;
          auVar75._12_4_ = 0xffffffff;
          auVar70 = packssdw(auVar70 ^ auVar75,auVar70 ^ auVar75);
          auVar70 = packsswb(auVar70,auVar70);
          if ((auVar70._0_4_ >> 8 & 1) != 0) {
            *(char *)((long)&pAVar38[1].next + uVar37 + uVar45 + 2) = cVar24 + '\x02';
          }
          auVar70 = (auVar68 | auVar29) ^ auVar31;
          auVar61._0_4_ = -(uint)(iVar33 < auVar70._0_4_);
          auVar61._4_4_ = -(uint)(iVar72 < auVar70._4_4_);
          auVar61._8_4_ = -(uint)(iVar73 < auVar70._8_4_);
          auVar61._12_4_ = -(uint)(iVar74 < auVar70._12_4_);
          auVar78._4_4_ = auVar61._0_4_;
          auVar78._0_4_ = auVar61._0_4_;
          auVar78._8_4_ = auVar61._8_4_;
          auVar78._12_4_ = auVar61._8_4_;
          iVar88 = -(uint)(auVar70._4_4_ == iVar72);
          iVar92 = -(uint)(auVar70._12_4_ == iVar74);
          auVar12._4_4_ = iVar88;
          auVar12._0_4_ = iVar88;
          auVar12._8_4_ = iVar92;
          auVar12._12_4_ = iVar92;
          auVar89._4_4_ = auVar61._4_4_;
          auVar89._0_4_ = auVar61._4_4_;
          auVar89._8_4_ = auVar61._12_4_;
          auVar89._12_4_ = auVar61._12_4_;
          auVar70 = auVar12 & auVar78 | auVar89;
          auVar70 = packssdw(auVar70,auVar70);
          auVar3._8_4_ = 0xffffffff;
          auVar3._0_8_ = 0xffffffffffffffff;
          auVar3._12_4_ = 0xffffffff;
          auVar70 = packssdw(auVar70 ^ auVar3,auVar70 ^ auVar3);
          auVar70 = packsswb(auVar70,auVar70);
          if ((auVar70._0_4_ >> 0x10 & 1) != 0) {
            *(char *)((long)&pAVar38[1].next + uVar37 + uVar45 + 3) = cVar24 + '\x03';
          }
          auVar70 = pshufhw(auVar70,auVar78,0x84);
          auVar13._4_4_ = iVar88;
          auVar13._0_4_ = iVar88;
          auVar13._8_4_ = iVar92;
          auVar13._12_4_ = iVar92;
          auVar75 = pshufhw(auVar61,auVar13,0x84);
          auVar50 = pshufhw(auVar70,auVar89,0x84);
          auVar51._8_4_ = 0xffffffff;
          auVar51._0_8_ = 0xffffffffffffffff;
          auVar51._12_4_ = 0xffffffff;
          auVar51 = (auVar50 | auVar75 & auVar70) ^ auVar51;
          auVar70 = packssdw(auVar51,auVar51);
          auVar70 = packsswb(auVar70,auVar70);
          if ((auVar70._0_4_ >> 0x18 & 1) != 0) {
            *(char *)((long)&pAVar38[1].next + uVar37 + uVar45 + 4) = cVar24 + '\x04';
          }
          auVar70 = (auVar68 | auVar28) ^ auVar31;
          auVar62._0_4_ = -(uint)(iVar33 < auVar70._0_4_);
          auVar62._4_4_ = -(uint)(iVar72 < auVar70._4_4_);
          auVar62._8_4_ = -(uint)(iVar73 < auVar70._8_4_);
          auVar62._12_4_ = -(uint)(iVar74 < auVar70._12_4_);
          auVar14._4_4_ = auVar62._0_4_;
          auVar14._0_4_ = auVar62._0_4_;
          auVar14._8_4_ = auVar62._8_4_;
          auVar14._12_4_ = auVar62._8_4_;
          auVar75 = pshuflw(auVar89,auVar14,0xe8);
          auVar52._0_4_ = -(uint)(auVar70._0_4_ == iVar33);
          auVar52._4_4_ = -(uint)(auVar70._4_4_ == iVar72);
          auVar52._8_4_ = -(uint)(auVar70._8_4_ == iVar73);
          auVar52._12_4_ = -(uint)(auVar70._12_4_ == iVar74);
          auVar79._4_4_ = auVar52._4_4_;
          auVar79._0_4_ = auVar52._4_4_;
          auVar79._8_4_ = auVar52._12_4_;
          auVar79._12_4_ = auVar52._12_4_;
          auVar70 = pshuflw(auVar52,auVar79,0xe8);
          auVar80._4_4_ = auVar62._4_4_;
          auVar80._0_4_ = auVar62._4_4_;
          auVar80._8_4_ = auVar62._12_4_;
          auVar80._12_4_ = auVar62._12_4_;
          auVar50 = pshuflw(auVar62,auVar80,0xe8);
          auVar4._8_4_ = 0xffffffff;
          auVar4._0_8_ = 0xffffffffffffffff;
          auVar4._12_4_ = 0xffffffff;
          auVar70 = packssdw(auVar70 & auVar75,(auVar50 | auVar70 & auVar75) ^ auVar4);
          auVar70 = packsswb(auVar70,auVar70);
          if ((auVar70 & (undefined1  [16])0x100000000) != (undefined1  [16])0x0) {
            *(char *)((long)&pAVar38[1].next + uVar37 + uVar45 + 5) = cVar24 + '\x05';
          }
          auVar15._4_4_ = auVar62._0_4_;
          auVar15._0_4_ = auVar62._0_4_;
          auVar15._8_4_ = auVar62._8_4_;
          auVar15._12_4_ = auVar62._8_4_;
          auVar80 = auVar79 & auVar15 | auVar80;
          auVar50 = packssdw(auVar80,auVar80);
          auVar5._8_4_ = 0xffffffff;
          auVar5._0_8_ = 0xffffffffffffffff;
          auVar5._12_4_ = 0xffffffff;
          auVar70 = packssdw(auVar70,auVar50 ^ auVar5);
          auVar70 = packsswb(auVar70,auVar70);
          if ((auVar70._4_2_ >> 8 & 1) != 0) {
            *(char *)((long)&pAVar38[1].next + uVar37 + uVar45 + 6) = cVar24 + '\x06';
          }
          auVar70 = (auVar68 | auVar27) ^ auVar31;
          auVar63._0_4_ = -(uint)(iVar33 < auVar70._0_4_);
          auVar63._4_4_ = -(uint)(iVar72 < auVar70._4_4_);
          auVar63._8_4_ = -(uint)(iVar73 < auVar70._8_4_);
          auVar63._12_4_ = -(uint)(iVar74 < auVar70._12_4_);
          auVar81._4_4_ = auVar63._0_4_;
          auVar81._0_4_ = auVar63._0_4_;
          auVar81._8_4_ = auVar63._8_4_;
          auVar81._12_4_ = auVar63._8_4_;
          iVar88 = -(uint)(auVar70._4_4_ == iVar72);
          iVar92 = -(uint)(auVar70._12_4_ == iVar74);
          auVar16._4_4_ = iVar88;
          auVar16._0_4_ = iVar88;
          auVar16._8_4_ = iVar92;
          auVar16._12_4_ = iVar92;
          auVar90._4_4_ = auVar63._4_4_;
          auVar90._0_4_ = auVar63._4_4_;
          auVar90._8_4_ = auVar63._12_4_;
          auVar90._12_4_ = auVar63._12_4_;
          auVar70 = auVar16 & auVar81 | auVar90;
          auVar70 = packssdw(auVar70,auVar70);
          auVar6._8_4_ = 0xffffffff;
          auVar6._0_8_ = 0xffffffffffffffff;
          auVar6._12_4_ = 0xffffffff;
          auVar70 = packssdw(auVar70 ^ auVar6,auVar70 ^ auVar6);
          auVar70 = packsswb(auVar70,auVar70);
          if ((auVar70 & (undefined1  [16])0x1000000000000) != (undefined1  [16])0x0) {
            *(char *)((long)&pAVar38[1].next + uVar37 + uVar45 + 7) = cVar24 + '\a';
          }
          auVar70 = pshufhw(auVar70,auVar81,0x84);
          auVar17._4_4_ = iVar88;
          auVar17._0_4_ = iVar88;
          auVar17._8_4_ = iVar92;
          auVar17._12_4_ = iVar92;
          auVar75 = pshufhw(auVar63,auVar17,0x84);
          auVar50 = pshufhw(auVar70,auVar90,0x84);
          auVar53._8_4_ = 0xffffffff;
          auVar53._0_8_ = 0xffffffffffffffff;
          auVar53._12_4_ = 0xffffffff;
          auVar53 = (auVar50 | auVar75 & auVar70) ^ auVar53;
          auVar70 = packssdw(auVar53,auVar53);
          auVar70 = packsswb(auVar70,auVar70);
          if ((auVar70._6_2_ >> 8 & 1) != 0) {
            *(char *)((long)&pAVar38[1].base + uVar37 + uVar45) = cVar24 + '\b';
          }
          auVar70 = (auVar68 | auVar48) ^ auVar31;
          auVar64._0_4_ = -(uint)(iVar33 < auVar70._0_4_);
          auVar64._4_4_ = -(uint)(iVar72 < auVar70._4_4_);
          auVar64._8_4_ = -(uint)(iVar73 < auVar70._8_4_);
          auVar64._12_4_ = -(uint)(iVar74 < auVar70._12_4_);
          auVar18._4_4_ = auVar64._0_4_;
          auVar18._0_4_ = auVar64._0_4_;
          auVar18._8_4_ = auVar64._8_4_;
          auVar18._12_4_ = auVar64._8_4_;
          auVar75 = pshuflw(auVar90,auVar18,0xe8);
          auVar54._0_4_ = -(uint)(auVar70._0_4_ == iVar33);
          auVar54._4_4_ = -(uint)(auVar70._4_4_ == iVar72);
          auVar54._8_4_ = -(uint)(auVar70._8_4_ == iVar73);
          auVar54._12_4_ = -(uint)(auVar70._12_4_ == iVar74);
          auVar82._4_4_ = auVar54._4_4_;
          auVar82._0_4_ = auVar54._4_4_;
          auVar82._8_4_ = auVar54._12_4_;
          auVar82._12_4_ = auVar54._12_4_;
          auVar70 = pshuflw(auVar54,auVar82,0xe8);
          auVar83._4_4_ = auVar64._4_4_;
          auVar83._0_4_ = auVar64._4_4_;
          auVar83._8_4_ = auVar64._12_4_;
          auVar83._12_4_ = auVar64._12_4_;
          auVar50 = pshuflw(auVar64,auVar83,0xe8);
          auVar65._8_4_ = 0xffffffff;
          auVar65._0_8_ = 0xffffffffffffffff;
          auVar65._12_4_ = 0xffffffff;
          auVar65 = (auVar50 | auVar70 & auVar75) ^ auVar65;
          auVar50 = packssdw(auVar65,auVar65);
          auVar70 = packsswb(auVar70 & auVar75,auVar50);
          if ((auVar70 & (undefined1  [16])0x1) != (undefined1  [16])0x0) {
            *(char *)((long)&pAVar38[1].base + uVar37 + uVar45 + 1) = cVar24 + '\t';
          }
          auVar19._4_4_ = auVar64._0_4_;
          auVar19._0_4_ = auVar64._0_4_;
          auVar19._8_4_ = auVar64._8_4_;
          auVar19._12_4_ = auVar64._8_4_;
          auVar83 = auVar82 & auVar19 | auVar83;
          auVar50 = packssdw(auVar83,auVar83);
          auVar7._8_4_ = 0xffffffff;
          auVar7._0_8_ = 0xffffffffffffffff;
          auVar7._12_4_ = 0xffffffff;
          auVar50 = packssdw(auVar50 ^ auVar7,auVar50 ^ auVar7);
          auVar70 = packsswb(auVar70,auVar50);
          if ((auVar70._8_2_ >> 8 & 1) != 0) {
            *(char *)((long)&pAVar38[1].base + uVar37 + uVar45 + 2) = cVar24 + '\n';
          }
          auVar70 = (auVar68 | auVar59) ^ auVar31;
          auVar66._0_4_ = -(uint)(iVar33 < auVar70._0_4_);
          auVar66._4_4_ = -(uint)(iVar72 < auVar70._4_4_);
          auVar66._8_4_ = -(uint)(iVar73 < auVar70._8_4_);
          auVar66._12_4_ = -(uint)(iVar74 < auVar70._12_4_);
          auVar84._4_4_ = auVar66._0_4_;
          auVar84._0_4_ = auVar66._0_4_;
          auVar84._8_4_ = auVar66._8_4_;
          auVar84._12_4_ = auVar66._8_4_;
          iVar88 = -(uint)(auVar70._4_4_ == iVar72);
          iVar92 = -(uint)(auVar70._12_4_ == iVar74);
          auVar20._4_4_ = iVar88;
          auVar20._0_4_ = iVar88;
          auVar20._8_4_ = iVar92;
          auVar20._12_4_ = iVar92;
          auVar91._4_4_ = auVar66._4_4_;
          auVar91._0_4_ = auVar66._4_4_;
          auVar91._8_4_ = auVar66._12_4_;
          auVar91._12_4_ = auVar66._12_4_;
          auVar70 = auVar20 & auVar84 | auVar91;
          auVar70 = packssdw(auVar70,auVar70);
          auVar8._8_4_ = 0xffffffff;
          auVar8._0_8_ = 0xffffffffffffffff;
          auVar8._12_4_ = 0xffffffff;
          auVar70 = packssdw(auVar70 ^ auVar8,auVar70 ^ auVar8);
          auVar70 = packsswb(auVar70,auVar70);
          if ((auVar70 & (undefined1  [16])0x10000) != (undefined1  [16])0x0) {
            *(char *)((long)&pAVar38[1].base + uVar37 + uVar45 + 3) = cVar24 + '\v';
          }
          auVar70 = pshufhw(auVar70,auVar84,0x84);
          auVar21._4_4_ = iVar88;
          auVar21._0_4_ = iVar88;
          auVar21._8_4_ = iVar92;
          auVar21._12_4_ = iVar92;
          auVar75 = pshufhw(auVar66,auVar21,0x84);
          auVar50 = pshufhw(auVar70,auVar91,0x84);
          auVar55._8_4_ = 0xffffffff;
          auVar55._0_8_ = 0xffffffffffffffff;
          auVar55._12_4_ = 0xffffffff;
          auVar55 = (auVar50 | auVar75 & auVar70) ^ auVar55;
          auVar70 = packssdw(auVar55,auVar55);
          auVar70 = packsswb(auVar70,auVar70);
          if ((auVar70._10_2_ >> 8 & 1) != 0) {
            *(char *)((long)&pAVar38[1].base + uVar37 + uVar45 + 4) = cVar24 + '\f';
          }
          auVar70 = (auVar68 | _DAT_001164a0) ^ auVar31;
          auVar67._0_4_ = -(uint)(iVar33 < auVar70._0_4_);
          auVar67._4_4_ = -(uint)(iVar72 < auVar70._4_4_);
          auVar67._8_4_ = -(uint)(iVar73 < auVar70._8_4_);
          auVar67._12_4_ = -(uint)(iVar74 < auVar70._12_4_);
          auVar22._4_4_ = auVar67._0_4_;
          auVar22._0_4_ = auVar67._0_4_;
          auVar22._8_4_ = auVar67._8_4_;
          auVar22._12_4_ = auVar67._8_4_;
          auVar75 = pshuflw(auVar91,auVar22,0xe8);
          auVar56._0_4_ = -(uint)(auVar70._0_4_ == iVar33);
          auVar56._4_4_ = -(uint)(auVar70._4_4_ == iVar72);
          auVar56._8_4_ = -(uint)(auVar70._8_4_ == iVar73);
          auVar56._12_4_ = -(uint)(auVar70._12_4_ == iVar74);
          auVar85._4_4_ = auVar56._4_4_;
          auVar85._0_4_ = auVar56._4_4_;
          auVar85._8_4_ = auVar56._12_4_;
          auVar85._12_4_ = auVar56._12_4_;
          auVar70 = pshuflw(auVar56,auVar85,0xe8);
          auVar86._4_4_ = auVar67._4_4_;
          auVar86._0_4_ = auVar67._4_4_;
          auVar86._8_4_ = auVar67._12_4_;
          auVar86._12_4_ = auVar67._12_4_;
          auVar50 = pshuflw(auVar67,auVar86,0xe8);
          auVar9._8_4_ = 0xffffffff;
          auVar9._0_8_ = 0xffffffffffffffff;
          auVar9._12_4_ = 0xffffffff;
          auVar70 = packssdw(auVar70 & auVar75,(auVar50 | auVar70 & auVar75) ^ auVar9);
          auVar70 = packsswb(auVar70,auVar70);
          if ((auVar70 & (undefined1  [16])0x100000000) != (undefined1  [16])0x0) {
            *(char *)((long)&pAVar38[1].base + uVar37 + uVar45 + 5) = cVar24 + '\r';
          }
          auVar23._4_4_ = auVar67._0_4_;
          auVar23._0_4_ = auVar67._0_4_;
          auVar23._8_4_ = auVar67._8_4_;
          auVar23._12_4_ = auVar67._8_4_;
          auVar86 = auVar85 & auVar23 | auVar86;
          auVar50 = packssdw(auVar86,auVar86);
          auVar10._8_4_ = 0xffffffff;
          auVar10._0_8_ = 0xffffffffffffffff;
          auVar10._12_4_ = 0xffffffff;
          auVar70 = packssdw(auVar70,auVar50 ^ auVar10);
          auVar70 = packsswb(auVar70,auVar70);
          if ((auVar70._12_2_ >> 8 & 1) != 0) {
            *(char *)((long)&pAVar38[1].base + uVar37 + uVar45 + 6) = cVar24 + '\x0e';
          }
          auVar70 = (auVar68 | _DAT_00116490) ^ auVar31;
          auVar57._0_4_ = -(uint)(iVar33 < auVar70._0_4_);
          auVar57._4_4_ = -(uint)(iVar72 < auVar70._4_4_);
          auVar57._8_4_ = -(uint)(iVar73 < auVar70._8_4_);
          auVar57._12_4_ = -(uint)(iVar74 < auVar70._12_4_);
          auVar87._4_4_ = auVar57._0_4_;
          auVar87._0_4_ = auVar57._0_4_;
          auVar87._8_4_ = auVar57._8_4_;
          auVar87._12_4_ = auVar57._8_4_;
          auVar69._4_4_ = -(uint)(auVar70._4_4_ == iVar72);
          auVar69._12_4_ = -(uint)(auVar70._12_4_ == iVar74);
          auVar69._0_4_ = auVar69._4_4_;
          auVar69._8_4_ = auVar69._12_4_;
          auVar71._4_4_ = auVar57._4_4_;
          auVar71._0_4_ = auVar57._4_4_;
          auVar71._8_4_ = auVar57._12_4_;
          auVar71._12_4_ = auVar57._12_4_;
          auVar50 = auVar69 & auVar87 | auVar71;
          auVar70 = packssdw(auVar57,auVar50);
          auVar11._8_4_ = 0xffffffff;
          auVar11._0_8_ = 0xffffffffffffffff;
          auVar11._12_4_ = 0xffffffff;
          auVar70 = packssdw(auVar70 ^ auVar11,auVar70 ^ auVar11);
          auVar70 = packsswb(auVar70,auVar70);
          if ((auVar70 & (undefined1  [16])0x1000000000000) != (undefined1  [16])0x0) {
            *(char *)((long)&pAVar38[1].base + uVar37 + uVar45 + 7) = cVar24 + '\x0f';
          }
          auVar70 = pshufhw(auVar70,auVar87,0x84);
          in_XMM2 = pshufhw(auVar50,auVar69,0x84);
          in_XMM2 = in_XMM2 & auVar70;
          auVar70 = pshufhw(auVar70,auVar71,0x84);
          auVar58._8_4_ = 0xffffffff;
          auVar58._0_8_ = 0xffffffffffffffff;
          auVar58._12_4_ = 0xffffffff;
          auVar58 = (auVar70 | in_XMM2) ^ auVar58;
          auVar70 = packssdw(auVar58,auVar58);
          in_XMM1 = packsswb(auVar70,auVar70);
          if ((in_XMM1._14_2_ >> 8 & 1) != 0) {
            *(char *)((long)&pAVar38[1].size + uVar37 + uVar45) = cVar24 + '\x10';
          }
          uVar37 = uVar37 + 0x10;
        } while (((int)size_00 + 0xeU & 0x1f0) != uVar37);
      }
      bVar32 = '\x01' << ((byte)uVar45 & 7);
      if (bVar46) {
        pbVar2 = (byte *)((long)&pAVar38[1].next + (uVar45 >> 3) + pAVar38->size);
        *pbVar2 = *pbVar2 | bVar32;
      }
      else {
        pbVar2 = (byte *)((long)&pAVar38[1].next + (uVar45 >> 3) + pAVar38->size);
        *pbVar2 = *pbVar2 & ~bVar32;
      }
      pAVar38->free = pAVar38->free - size_00;
      if (uVar45 == pAVar38->first) {
        pAVar38->first = uVar45 + size_00;
      }
    }
  }
  pvVar35 = pthread_getspecific(tsdKey);
  piVar1 = (int *)((long)pvVar35 + 0x460);
  *piVar1 = *piVar1 + -1;
  iVar33 = *piVar1;
joined_r0x00106b77:
  if (iVar33 == 0) {
    pthread_mutex_unlock((pthread_mutex_t *)&mutexRange);
  }
LAB_00106b85:
  if (pool->pages == (Page *)0x0) {
    pool->pages = addr;
    auVar59 = _DAT_00116510;
    lVar39 = 0;
    auVar48 = _DAT_00116500;
    do {
      if (SUB164(auVar48 ^ auVar59,4) == -0x80000000 && SUB164(auVar48 ^ auVar59,0) < -0x7fffff81) {
        pool->lastFreeCell[lVar39] = (Cell *)addr;
        pool->lastFreeCell[lVar39 + 1] = (Cell *)addr;
      }
      lVar39 = lVar39 + 2;
      lVar49 = auVar48._8_8_;
      auVar48._0_8_ = auVar48._0_8_ + 2;
      auVar48._8_8_ = lVar49 + 2;
    } while (lVar39 != 0x80);
  }
  auVar59._8_4_ = (int)__denom;
  auVar59._0_8_ = __denom;
  auVar59._12_4_ = (int)(__denom >> 0x20);
  pool->nbPages = __denom + pool->nbPages;
  pool->nbAlloc = auVar59._8_8_ + pool->nbAlloc;
  pool->nbSetCells = pool->nbSetCells + __denom;
  pacVar25 = pool->lastPage;
  pacVar26 = addr;
  pacVar44 = addr;
  for (; __denom != 0; __denom = __denom - 1) {
    if (pacVar25 != (Page *)0x0) {
      *(ulong *)*pacVar25 = CONCAT71((int7)((ulong)pacVar44 >> 8),(*pacVar25)[0]);
    }
    (*pacVar26)[0] = (byte)pool->generation & 0xf;
    *(undefined8 *)(*pacVar26 + 8) = *(undefined8 *)((long)pvVar34 + 8);
    *(char *)((long)pacVar26 + 0x11) = '\0';
    *(char *)((long)pacVar26 + 0x12) = '\0';
    *(char *)((long)pacVar26 + 0x13) = '\0';
    *(char *)((long)pacVar26 + 0x14) = '\0';
    *(char *)((long)pacVar26 + 0x15) = '\0';
    *(char *)((long)pacVar26 + 0x16) = '\0';
    *(char *)((long)pacVar26 + 0x17) = '\0';
    *(char *)((long)pacVar26 + 0x18) = '\0';
    *(char *)((long)pacVar26 + 0x18) = '\0';
    *(char *)((long)pacVar26 + 0x19) = '\0';
    *(char *)((long)pacVar26 + 0x1a) = '\0';
    *(char *)((long)pacVar26 + 0x1b) = '\0';
    *(char *)((long)pacVar26 + 0x1c) = '\0';
    *(char *)((long)pacVar26 + 0x1d) = '\0';
    *(char *)((long)pacVar26 + 0x1e) = '\0';
    *(char *)((long)pacVar26 + 0x1f) = '\0';
    (*pacVar26)[0x10] = '\x01';
    pacVar44 = pacVar44 + 1;
    pacVar25 = pacVar26;
    pacVar26 = pacVar26 + 1;
  }
  pool->lastPage = pacVar25;
  (*addr)[0] = (*addr)[0] | 0x10;
  *(ulong *)*pacVar25 = (ulong)(byte)(*pacVar25)[0] | 0x20;
  return;
}

Assistant:

void
PoolAllocPages(
    MemoryPool *pool,   /*!< Pool to allocate pages into. */
    size_t number)      /*!< Number of pages to allocate. */
{
    ThreadData *data = PlatGetThreadData();
    Page *base, *page, *prev;
    const size_t nbPagesPerSysPage = systemPageSize/PAGE_SIZE;
    size_t nbSysPages, nbPages;
    size_t i;

    if (number == 1) {
        /*
         * Regular case: allocate one physical page divided into equally sized
         * logical pages.
         */

        nbSysPages = 1;
        nbPages = nbPagesPerSysPage;
    } else {
        /*
         * Allocate enough physical pages for the given number of logical pages.
         */

        lldiv_t d = lldiv(number, nbPagesPerSysPage);
        nbSysPages = d.quot + (d.rem?1:0);
        if (nbSysPages >= LARGE_PAGE_SIZE) {
            /*
             * Pages are in their own dedicated range.
             */

            nbPages = 1;
        } else {
            nbPages = (nbSysPages * nbPagesPerSysPage) - number + 1;
        }
    }

    /*
     * Allocate system pages. Make sure to mark pages as written for older
     * generations for proper parent tracking.
     */

    base = (Page *) SysPageAlloc(nbSysPages, (pool->generation >= 2));

    if (!pool->pages) {
        pool->pages = base;
        for (i = 0; i < AVAILABLE_CELLS; i++) {
            pool->lastFreeCell[i] = PAGE_CELL(base, 0);
        }
    }

    pool->nbPages += nbPages;
    pool->nbAlloc += nbPages;
    pool->nbSetCells += RESERVED_CELLS*nbPages;

    /*
     * Initialize pages.
     */

    prev = pool->lastPage;
    for (i = 0, page = base; i < nbPages; i++, page++) {
        /*
         * Pages are linked in order.
         */

        if (prev) {
            PAGE_SET_NEXT(prev, page);
        }
        prev = page;

        PAGE_SET_GENERATION(page, pool->generation);
        PAGE_CLEAR_FLAG(page, PAGE_FLAGS_MASK);
        PAGE_GROUPDATA(page) = data->groupData;

        /* Initialize bit mask for allocated cells. */
        ClearAllCells(page);
    }
    pool->lastPage = prev;
    PAGE_SET_FLAG(base, PAGE_FLAG_FIRST);
    PAGE_SET_NEXT(prev, NULL);
    PAGE_SET_FLAG(prev, PAGE_FLAG_LAST);
}